

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cli.c
# Opt level: O2

int handle_connection(int sockfd,ptls_context_t *ctx,char *server_name,char *input_file,
                     ptls_handshake_properties_t *hsprop,int request_key_update,int keep_sender_open
                     )

{
  ptls_early_data_acceptance_t pVar1;
  ulong *puVar2;
  ulong uVar3;
  FILE *__stream;
  uint __i;
  uint uVar4;
  int iVar5;
  int iVar6;
  ptls_t *tls;
  int *piVar7;
  char *pcVar8;
  long lVar9;
  ssize_t sVar10;
  size_t sVar11;
  uint64_t uVar12;
  ptls_cipher_suite_t *ppVar13;
  uint uVar14;
  ulong uVar15;
  uint uVar16;
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  uint local_42c4;
  uint local_42c0;
  uint local_42bc;
  ptls_buffer_t local_4290;
  ulong local_4270;
  long local_4268;
  ptls_buffer_t local_4260;
  int local_423c;
  double local_4238;
  double dStack_4230;
  uint64_t local_4220;
  char *local_4218;
  ulong local_4210;
  ptls_buffer_t local_4208;
  timeval timeout;
  size_t leftlen;
  fd_set exceptfds;
  fd_set readfds;
  fd_set writefds;
  char bytebuf [16384];
  
  local_423c = request_key_update;
  if (server_name == (char *)0x0) {
    tls = ptls_server_new(ctx);
  }
  else {
    tls = ptls_client_new(ctx);
  }
  local_4220 = (*ctx->get_time->cb)(ctx->get_time);
  local_4208.base = "";
  local_4208.is_allocated = 0;
  local_4208.capacity = 0;
  local_4208.off = 0;
  local_4260.base = "";
  local_4260.capacity = 0;
  local_4260.off = 0;
  local_4260.is_allocated = 0;
  local_4290.base = "";
  local_4290.capacity = 0;
  local_4290.off = 0;
  local_4290.is_allocated = 0;
  local_42c4 = 0;
  fcntl(sockfd,4,0x800);
  if (input_file == "is:benchmark") {
    iVar5 = ptls_is_server(tls);
    local_42c4 = (uint)(iVar5 != 0) * 2 - 2;
  }
  else if ((input_file != (char *)0x0) &&
          (local_42c4 = open(input_file,0), __stream = _stderr, local_42c4 == 0xffffffff)) {
    local_42c4 = 0xffffffff;
    local_42c0 = 1;
    piVar7 = __errno_location();
    pcVar8 = strerror(*piVar7);
    fprintf(__stream,"failed to open file:%s:%s\n",input_file,pcVar8);
    goto LAB_0010739a;
  }
  local_42c0 = 0;
  if (server_name != (char *)0x0) {
    ptls_set_server_name(tls,server_name,0);
    uVar4 = ptls_handshake(tls,&local_4260,(void *)0x0,(size_t *)0x0,hsprop);
    local_42c0 = 0x202;
    if (uVar4 != 0x202) {
      local_4268 = 0;
      fprintf(_stderr,"ptls_handshake:%d\n",(ulong)uVar4);
      local_42c0 = 1;
LAB_0010738c:
      if (input_file == "is:benchmark") {
        uVar12 = (*ctx->get_time->cb)(ctx->get_time);
        lVar9 = uVar12 - local_4220;
        auVar17._8_4_ = (int)((ulong)lVar9 >> 0x20);
        auVar17._0_8_ = lVar9;
        auVar17._12_4_ = 0x45300000;
        dStack_4230 = auVar17._8_8_ - 1.9342813113834067e+25;
        local_4238 = (dStack_4230 + ((double)CONCAT44(0x43300000,(int)lVar9) - 4503599627370496.0))
                     / 1000.0;
        ppVar13 = ptls_get_cipher(tls);
        lVar9 = local_4268 * 8;
        auVar18._8_4_ = (int)((ulong)lVar9 >> 0x20);
        auVar18._0_8_ = lVar9;
        auVar18._12_4_ = 0x45300000;
        if (ppVar13 == (ptls_cipher_suite_t *)0x0) {
          pcVar8 = "unknown cipher";
        }
        else {
          pcVar8 = ppVar13->aead->name;
        }
        fprintf(_stderr,"received %lu bytes in %.3f seconds (%f.3Mbps); %s\n",local_4238,
                ((((auVar18._8_8_ - 1.9342813113834067e+25) +
                  ((double)CONCAT44(0x43300000,(int)lVar9) - 4503599627370496.0)) / local_4238) /
                1000.0) / 1000.0,local_4268,pcVar8);
      }
LAB_0010739a:
      if (sockfd != -1) {
        close(sockfd);
      }
      if (((input_file != (char *)0x0) && (input_file != "is:benchmark")) && (-1 < (int)local_42c4))
      {
        close(local_42c4);
      }
      ptls_buffer_dispose(&local_4208);
      ptls_buffer_dispose(&local_4260);
      ptls_buffer_dispose(&local_4290);
      ptls_free(tls);
      return (int)(local_42c0 != 0);
    }
  }
  iVar5 = sockfd / 0x40;
  uVar15 = 1L << ((byte)sockfd & 0x3f);
  local_4268 = 0;
  local_4270 = 0;
  local_42bc = 0;
  local_4218 = server_name;
  local_4210 = uVar15;
LAB_00106d99:
  local_4238 = (double)(1L << ((byte)local_42c4 & 0x3f));
  uVar14 = local_42c4 >> 6;
  uVar4 = sockfd;
  if (sockfd < (int)local_42c4) {
    uVar4 = local_42c4;
  }
  lVar9 = 0;
  do {
    for (; lVar9 != 0x10; lVar9 = lVar9 + 1) {
      readfds.fds_bits[lVar9] = 0;
    }
    for (lVar9 = 0; lVar9 != 0x10; lVar9 = lVar9 + 1) {
      writefds.fds_bits[lVar9] = 0;
    }
    for (lVar9 = 0; lVar9 != 0x10; lVar9 = lVar9 + 1) {
      exceptfds.fds_bits[lVar9] = 0;
    }
    readfds.fds_bits[iVar5] = readfds.fds_bits[iVar5] | uVar15;
    if ((local_4260.off != 0) || (local_42c4 == 0xfffffffe)) {
      writefds.fds_bits[iVar5] = writefds.fds_bits[iVar5] | uVar15;
    }
    exceptfds.fds_bits[iVar5] = exceptfds.fds_bits[iVar5] | uVar15;
    uVar16 = sockfd;
    if (-1 < (int)local_42c4) {
      puVar2 = (ulong *)((long)readfds.fds_bits + (ulong)(uVar14 * 8));
      *puVar2 = *puVar2 | (ulong)local_4238;
      puVar2 = (ulong *)((long)exceptfds.fds_bits + (ulong)(uVar14 * 8));
      *puVar2 = *puVar2 | (ulong)local_4238;
      uVar16 = uVar4;
    }
    timeout.tv_sec = 0;
    if (local_4260.off == 0) {
      timeout.tv_sec = 0xe10;
    }
    timeout.tv_usec = 0;
    iVar6 = select(uVar16 + 1,(fd_set *)&readfds,(fd_set *)&writefds,(fd_set *)&exceptfds,
                   (timeval *)&timeout);
    lVar9 = 0;
  } while (iVar6 == -1);
  if (((readfds.fds_bits[iVar5] & uVar15) != 0) || ((exceptfds.fds_bits[iVar5] & uVar15) != 0)) {
    do {
      sVar10 = read(sockfd,bytebuf,0x4000);
      if (sVar10 != -1) {
        if (sVar10 < 1) goto LAB_0010738c;
        goto LAB_00106f12;
      }
      piVar7 = __errno_location();
    } while (*piVar7 == 4);
    if (*piVar7 != 0xb) goto LAB_0010738c;
    sVar10 = 0;
LAB_00106f12:
    for (lVar9 = 0; leftlen = sVar10 - lVar9, leftlen != 0; lVar9 = lVar9 + leftlen) {
      if (local_42bc == 0) {
        local_42c0 = ptls_handshake(tls,&local_4260,bytebuf + lVar9,&leftlen,hsprop);
        if (local_42c0 == 0x202) {
          local_42bc = 0;
        }
        else {
          if (local_42c0 != 0) {
            if (local_4260.off != 0) {
              write(sockfd,local_4260.base,local_4260.off);
            }
            pcVar8 = "ptls_handshake:%d\n";
            goto LAB_0010755d;
          }
          iVar6 = ptls_is_server(tls);
          pVar1 = (hsprop->field_0).client.early_data_acceptance;
          if (iVar6 == 0 && pVar1 == PTLS_EARLY_DATA_ACCEPTANCE_UNKNOWN) {
            __assert_fail("ptls_is_server(tls) || hsprop->client.early_data_acceptance != PTLS_EARLY_DATA_ACCEPTANCE_UNKNOWN"
                          ,
                          "/workspace/llm4binary/github/license_all_cmakelists_1510/herumi[P]picotls/t/cli.c"
                          ,0x95,
                          "int handle_connection(int, ptls_context_t *, const char *, const char *, ptls_handshake_properties_t *, int, int)"
                         );
          }
          if (pVar1 == PTLS_EARLY_DATA_ACCEPTED) {
            shift_buffer(&local_4290,local_4270);
          }
          local_42c0 = 0;
          if (local_423c == 0) {
            local_42bc = 1;
          }
          else {
            local_42bc = 1;
            ptls_update_key(tls,1);
            local_42c0 = 0;
            uVar15 = local_4210;
          }
        }
      }
      else {
        local_42c0 = ptls_receive(tls,&local_4208,bytebuf + lVar9,&leftlen);
        sVar11 = local_4208.off;
        if (local_42c0 != 0x202) {
          if (local_42c0 != 0) {
            fprintf(_stderr,"ptls_receive:%d\n",(ulong)local_42c0);
            goto LAB_0010738c;
          }
          if (local_4208.off != 0) {
            if (input_file != "is:benchmark") {
              write(1,local_4208.base,local_4208.off);
            }
            local_4268 = local_4268 + sVar11;
            local_4208.off = 0;
          }
          local_42c0 = 0;
        }
      }
    }
  }
  if ((local_4260.off == 0) || (local_42bc == 0)) {
    if ((int)local_42c4 < 0) {
      if (local_42c4 != 0xfffffffe) goto LAB_0010715f;
      if (local_4290.capacity < 0x4000) {
        local_42c0 = ptls_buffer_reserve(&local_4290,0x4000 - local_4290.capacity);
        if (local_42c0 != 0) {
          local_42c4 = 0xfffffffe;
          goto LAB_0010738c;
        }
        memset(local_4290.base + local_4290.capacity,0,0x4000 - local_4290.capacity);
        local_42c0 = 0;
      }
      local_4290.off = 0x4000;
      local_42c4 = 0xfffffffe;
LAB_00107164:
      if (local_42bc == 0) {
        if ((local_4218 != (char *)0x0) &&
           (puVar2 = (hsprop->field_0).client.max_early_data_size, puVar2 != (ulong *)0x0)) {
          uVar3 = *puVar2;
          sVar11 = local_4290.off;
          if (uVar3 < local_4290.off) {
            sVar11 = uVar3;
          }
          if (sVar11 - local_4270 != 0) {
            local_42c0 = ptls_send(tls,&local_4260,local_4290.base,sVar11 - local_4270);
            if (local_42c0 != 0) {
              fprintf(_stderr,"ptls_send(early_data):%d\n",(ulong)local_42c0);
              goto LAB_0010738c;
            }
            local_42c0 = 0;
            local_4270 = sVar11;
          }
        }
      }
      else {
        local_42c0 = ptls_send(tls,&local_4260,local_4290.base,local_4290.off);
        if (local_42c0 != 0) {
          pcVar8 = "ptls_send(1rtt):%d\n";
LAB_0010755d:
          fprintf(_stderr,pcVar8,(ulong)local_42c0);
          goto LAB_0010738c;
        }
        local_4290.off = 0;
        local_42c0 = 0;
      }
      goto LAB_001071fb;
    }
    if (((readfds.fds_bits[uVar14] & (ulong)local_4238) == 0) &&
       ((exceptfds.fds_bits[uVar14] & (ulong)local_4238) == 0)) goto LAB_0010715f;
    local_42c0 = ptls_buffer_reserve(&local_4290,0x4000);
    if (local_42c0 != 0) goto LAB_0010738c;
    do {
      sVar10 = read(local_42c4,local_4290.base + local_4290.off,0x4000);
      if (sVar10 != -1) {
        if (0 < sVar10) {
          local_4290.off = sVar10 + local_4290.off;
          local_42c0 = 0;
          goto LAB_0010715f;
        }
        if (sVar10 == 0 && input_file != (char *)0x0) {
          close(local_42c4);
          local_42c4 = 0xffffffff;
        }
        else {
          local_42c4 = local_42c4 | -(uint)(sVar10 == 0);
        }
        break;
      }
      piVar7 = __errno_location();
    } while (*piVar7 == 4);
    local_42c0 = 0;
  }
LAB_0010715f:
  if (local_4290.off != 0) goto LAB_00107164;
LAB_001071fb:
  if (local_4260.off != 0) {
    do {
      sVar11 = write(sockfd,local_4260.base,local_4260.off);
      if (sVar11 != 0xffffffffffffffff) {
        if ((long)sVar11 < 1) goto LAB_0010738c;
        shift_buffer(&local_4260,sVar11);
        goto LAB_0010724c;
      }
      piVar7 = __errno_location();
    } while (*piVar7 == 4);
    if (*piVar7 != 0xb) goto LAB_0010738c;
  }
LAB_0010724c:
  uVar4 = local_42bc ^ 1;
  if (local_42c4 == 0xffffffff && uVar4 == 0) {
    local_42bc = 2;
  }
  if ((local_42c4 == 0xffffffff && uVar4 == 0) && keep_sender_open == 0) {
    bytebuf._0_8_ = &leftlen;
    bytebuf[0x10] = '\0';
    bytebuf[0x11] = '\0';
    bytebuf[0x12] = '\0';
    bytebuf[0x13] = '\0';
    bytebuf[0x14] = '\0';
    bytebuf[0x15] = '\0';
    bytebuf[0x16] = '\0';
    bytebuf[0x17] = '\0';
    bytebuf[8] = ' ';
    bytebuf[9] = '\0';
    bytebuf[10] = '\0';
    bytebuf[0xb] = '\0';
    bytebuf[0xc] = '\0';
    bytebuf[0xd] = '\0';
    bytebuf[0xe] = '\0';
    bytebuf[0xf] = '\0';
    bytebuf[0x18] = '\0';
    bytebuf[0x19] = '\0';
    bytebuf[0x1a] = '\0';
    bytebuf[0x1b] = '\0';
    local_42c0 = ptls_send_alert(tls,(ptls_buffer_t *)bytebuf,'\x01','\0');
    if (local_42c0 != 0) {
      fprintf(_stderr,"ptls_send_alert:%d\n",(ulong)local_42c0);
    }
    if (bytebuf._16_8_ != 0) {
      write(sockfd,(void *)bytebuf._0_8_,bytebuf._16_8_);
    }
    ptls_buffer_dispose((ptls_buffer_t *)bytebuf);
    shutdown(sockfd,1);
    local_42bc = 2;
  }
  goto LAB_00106d99;
}

Assistant:

static int handle_connection(int sockfd, ptls_context_t *ctx, const char *server_name, const char *input_file,
                             ptls_handshake_properties_t *hsprop, int request_key_update, int keep_sender_open)
{
    static const int inputfd_is_benchmark = -2;

    ptls_t *tls = ptls_new(ctx, server_name == NULL);
    ptls_buffer_t rbuf, encbuf, ptbuf;
    enum { IN_HANDSHAKE, IN_1RTT, IN_SHUTDOWN } state = IN_HANDSHAKE;
    int inputfd = 0, ret = 0;
    size_t early_bytes_sent = 0;
    uint64_t data_received = 0;
    ssize_t ioret;

    uint64_t start_at = ctx->get_time->cb(ctx->get_time);

    ptls_buffer_init(&rbuf, "", 0);
    ptls_buffer_init(&encbuf, "", 0);
    ptls_buffer_init(&ptbuf, "", 0);

    fcntl(sockfd, F_SETFL, O_NONBLOCK);

    if (input_file == input_file_is_benchmark) {
        if (!ptls_is_server(tls))
            inputfd = inputfd_is_benchmark;
    } else if (input_file != NULL) {
        if ((inputfd = open(input_file, O_RDONLY)) == -1) {
            fprintf(stderr, "failed to open file:%s:%s\n", input_file, strerror(errno));
            ret = 1;
            goto Exit;
        }
    }
    if (server_name != NULL) {
        ptls_set_server_name(tls, server_name, 0);
        if ((ret = ptls_handshake(tls, &encbuf, NULL, NULL, hsprop)) != PTLS_ERROR_IN_PROGRESS) {
            fprintf(stderr, "ptls_handshake:%d\n", ret);
            ret = 1;
            goto Exit;
        }
    }

    while (1) {
        /* check if data is available */
        fd_set readfds, writefds, exceptfds;
        int maxfd = 0;
        struct timeval timeout;
        do {
            FD_ZERO(&readfds);
            FD_ZERO(&writefds);
            FD_ZERO(&exceptfds);
            FD_SET(sockfd, &readfds);
            if (encbuf.off != 0 || inputfd == inputfd_is_benchmark)
                FD_SET(sockfd, &writefds);
            FD_SET(sockfd, &exceptfds);
            maxfd = sockfd + 1;
            if (inputfd >= 0) {
                FD_SET(inputfd, &readfds);
                FD_SET(inputfd, &exceptfds);
                if (maxfd <= inputfd)
                    maxfd = inputfd + 1;
            }
            timeout.tv_sec = encbuf.off != 0 ? 0 : 3600;
            timeout.tv_usec = 0;
        } while (select(maxfd, &readfds, &writefds, &exceptfds, &timeout) == -1);

        /* consume incoming messages */
        if (FD_ISSET(sockfd, &readfds) || FD_ISSET(sockfd, &exceptfds)) {
            char bytebuf[16384];
            size_t off = 0, leftlen;
            while ((ioret = read(sockfd, bytebuf, sizeof(bytebuf))) == -1 && errno == EINTR)
                ;
            if (ioret == -1 && (errno == EWOULDBLOCK || errno == EAGAIN)) {
                /* no data */
                ioret = 0;
            } else if (ioret <= 0) {
                goto Exit;
            }
            while ((leftlen = ioret - off) != 0) {
                if (state == IN_HANDSHAKE) {
                    if ((ret = ptls_handshake(tls, &encbuf, bytebuf + off, &leftlen, hsprop)) == 0) {
                        state = IN_1RTT;
                        assert(ptls_is_server(tls) || hsprop->client.early_data_acceptance != PTLS_EARLY_DATA_ACCEPTANCE_UNKNOWN);
                        /* release data sent as early-data, if server accepted it */
                        if (hsprop->client.early_data_acceptance == PTLS_EARLY_DATA_ACCEPTED)
                            shift_buffer(&ptbuf, early_bytes_sent);
                        if (request_key_update)
                            ptls_update_key(tls, 1);
                    } else if (ret == PTLS_ERROR_IN_PROGRESS) {
                        /* ok */
                    } else {
                        if (encbuf.off != 0)
                            (void)write(sockfd, encbuf.base, encbuf.off);
                        fprintf(stderr, "ptls_handshake:%d\n", ret);
                        goto Exit;
                    }
                } else {
                    if ((ret = ptls_receive(tls, &rbuf, bytebuf + off, &leftlen)) == 0) {
                        if (rbuf.off != 0) {
                            data_received += rbuf.off;
                            if (input_file != input_file_is_benchmark)
                                write(1, rbuf.base, rbuf.off);
                            rbuf.off = 0;
                        }
                    } else if (ret == PTLS_ERROR_IN_PROGRESS) {
                        /* ok */
                    } else {
                        fprintf(stderr, "ptls_receive:%d\n", ret);
                        goto Exit;
                    }
                }
                off += leftlen;
            }
        }

        /* encrypt data to send, if any is available */
        if (encbuf.off == 0 || state == IN_HANDSHAKE) {
            static const size_t block_size = 16384;
            if (inputfd >= 0 && (FD_ISSET(inputfd, &readfds) || FD_ISSET(inputfd, &exceptfds))) {
                if ((ret = ptls_buffer_reserve(&ptbuf, block_size)) != 0)
                    goto Exit;
                while ((ioret = read(inputfd, ptbuf.base + ptbuf.off, block_size)) == -1 && errno == EINTR)
                    ;
                if (ioret > 0) {
                    ptbuf.off += ioret;
                } else if (ioret == 0) {
                    /* closed */
                    if (input_file != NULL)
                        close(inputfd);
                    inputfd = -1;
                }
            } else if (inputfd == inputfd_is_benchmark) {
                if (ptbuf.capacity < block_size) {
                    if ((ret = ptls_buffer_reserve(&ptbuf, block_size - ptbuf.capacity)) != 0)
                        goto Exit;
                    memset(ptbuf.base + ptbuf.capacity, 0, block_size - ptbuf.capacity);
                }
                ptbuf.off = block_size;
            }
        }
        if (ptbuf.off != 0) {
            if (state == IN_HANDSHAKE) {
                size_t send_amount = 0;
                if (server_name != NULL && hsprop->client.max_early_data_size != NULL) {
                    size_t max_can_be_sent = *hsprop->client.max_early_data_size;
                    if (max_can_be_sent > ptbuf.off)
                        max_can_be_sent = ptbuf.off;
                    send_amount = max_can_be_sent - early_bytes_sent;
                }
                if (send_amount != 0) {
                    if ((ret = ptls_send(tls, &encbuf, ptbuf.base, send_amount)) != 0) {
                        fprintf(stderr, "ptls_send(early_data):%d\n", ret);
                        goto Exit;
                    }
                    early_bytes_sent += send_amount;
                }
            } else {
                if ((ret = ptls_send(tls, &encbuf, ptbuf.base, ptbuf.off)) != 0) {
                    fprintf(stderr, "ptls_send(1rtt):%d\n", ret);
                    goto Exit;
                }
                ptbuf.off = 0;
            }
        }

        /* send any data */
        if (encbuf.off != 0) {
            while ((ioret = write(sockfd, encbuf.base, encbuf.off)) == -1 && errno == EINTR)
                ;
            if (ioret == -1 && (errno == EWOULDBLOCK || errno == EAGAIN)) {
                /* no data */
            } else if (ioret <= 0) {
                goto Exit;
            } else {
                shift_buffer(&encbuf, ioret);
            }
        }

        /* close the sender side when necessary */
        if (state == IN_1RTT && inputfd == -1) {
            if (!keep_sender_open) {
                ptls_buffer_t wbuf;
                uint8_t wbuf_small[32];
                ptls_buffer_init(&wbuf, wbuf_small, sizeof(wbuf_small));
                if ((ret = ptls_send_alert(tls, &wbuf, PTLS_ALERT_LEVEL_WARNING, PTLS_ALERT_CLOSE_NOTIFY)) != 0) {
                    fprintf(stderr, "ptls_send_alert:%d\n", ret);
                }
                if (wbuf.off != 0)
                    (void)write(sockfd, wbuf.base, wbuf.off);
                ptls_buffer_dispose(&wbuf);
                shutdown(sockfd, SHUT_WR);
            }
            state = IN_SHUTDOWN;
        }
    }

Exit:
    if (input_file == input_file_is_benchmark) {
        double elapsed = (ctx->get_time->cb(ctx->get_time) - start_at) / 1000.0;
        ptls_cipher_suite_t *cipher_suite = ptls_get_cipher(tls);
        fprintf(stderr, "received %" PRIu64 " bytes in %.3f seconds (%f.3Mbps); %s\n", data_received, elapsed,
                data_received * 8 / elapsed / 1000 / 1000, cipher_suite != NULL ? cipher_suite->aead->name : "unknown cipher");
    }

    if (sockfd != -1)
        close(sockfd);
    if (input_file != NULL && input_file != input_file_is_benchmark && inputfd >= 0)
        close(inputfd);
    ptls_buffer_dispose(&rbuf);
    ptls_buffer_dispose(&encbuf);
    ptls_buffer_dispose(&ptbuf);
    ptls_free(tls);

    return ret != 0;
}